

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_importSourceGetSetModel_Test::Importer_importSourceGetSetModel_Test
          (Importer_importSourceGetSetModel_Test *this)

{
  Importer_importSourceGetSetModel_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Importer_importSourceGetSetModel_Test_001a14b8;
  return;
}

Assistant:

TEST(Importer, importSourceGetSetModel)
{
    auto model = libcellml::Model::create("m");
    auto component = libcellml::Component::create("c");
    auto importsource = libcellml::ImportSource::create();

    component->setImportSource(importsource);
    EXPECT_EQ(nullptr, importsource->model());

    importsource->setModel(nullptr);
    EXPECT_EQ(nullptr, importsource->model());

    importsource->setModel(model);
    EXPECT_EQ(model, importsource->model());

    importsource->removeModel();
    EXPECT_EQ(nullptr, importsource->model());
}